

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O2

void __thiscall jsonip::writer<true>::new_string(writer<true> *this,char *str)

{
  ostream *poVar1;
  
  pre(this);
  poVar1 = std::operator<<(this->os,'\"');
  poVar1 = std::operator<<(poVar1,str);
  std::operator<<(poVar1,'\"');
  this->comma = true;
  return;
}

Assistant:

void new_string(const char * str)
        {
            pre();
            // TODO escape
            os << '"' << str << '"';
            comma = true;
        }